

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O0

void test_fuzz(files *filesets)

{
  size_t v1;
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  time_t tVar6;
  size_t v2;
  int local_a4;
  int trycnt;
  int numbytes;
  int j;
  FILE *f;
  char *newraw;
  int local_80;
  int r;
  int q;
  int i;
  size_t oldsize;
  size_t size;
  char *tmp;
  char *image;
  char *rawimage;
  archive *a;
  archive_entry *ae;
  size_t buffsize;
  char *skip_fuzz_tests;
  int n;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  files *filesets_local;
  
  blk = filesets;
  buffsize = (size_t)getenv("SKIP_TEST_FUZZ");
  if ((char *)buffsize == (char *)0x0) {
    skip_fuzz_tests._4_4_ = 0;
    buffsize = 0;
    while (*(long *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) != 0) {
      ae = (archive_entry *)(buff3 + 0x4ccb20);
      image = (char *)0x0;
      tmp = (char *)0x0;
      size = 0;
      oldsize = 0;
      _q = 0;
      extract_reference_files(*(char ***)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8));
      if (*(int *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10) == 0) {
        r = 0;
        while (*(long *)(*(long *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) + (long)r * 8
                        ) != 0) {
          size = (size_t)slurpfile(&oldsize,"%s",
                                   *(undefined8 *)
                                    (*(long *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) +
                                    (long)r * 8));
          pcVar5 = (char *)realloc(image,_q + oldsize);
          wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'|',(uint)(pcVar5 != (char *)0x0),"newraw != NULL",(void *)0x0)
          ;
          if (wVar2 == L'\0') {
            free((void *)size);
            oldsize = 0;
            break;
          }
          image = pcVar5;
          memcpy(pcVar5 + _q,(void *)size,oldsize);
          _q = oldsize + _q;
          oldsize = _q;
          free((void *)size);
          r = r + 1;
        }
LAB_00151fe4:
        if (oldsize == 0) {
          free(image);
        }
        else {
          tmp = (char *)malloc(oldsize);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\x8f',(uint)(tmp != (char *)0x0),"image != NULL",(void *)0x0);
          if (tmp == (char *)0x0) {
            free(image);
            return;
          }
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\x96',(uint)(image != (char *)0x0),"rawimage != NULL",(void *)0x0);
          tVar6 = time((time_t *)0x0);
          srand((uint)tVar6);
          for (r = 0; r < 1000; r = r + 1) {
            memcpy(tmp,image,oldsize);
            local_80 = (int)((long)((ulong)(uint)((int)oldsize >> 0x1f) << 0x20 |
                                   oldsize & 0xffffffff) / 100);
            if (local_80 < 4) {
              local_80 = 4;
            }
            iVar1 = rand();
            for (trycnt = 0; trycnt < iVar1 % local_80; trycnt = trycnt + 1) {
              iVar3 = rand();
              pcVar5 = tmp;
              iVar4 = rand();
              pcVar5[(ulong)(long)iVar4 % oldsize] = (char)iVar3;
            }
            local_a4 = 0;
            while ((local_a4 < 3 &&
                   (_numbytes = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                                      ,"wb"), _numbytes == (FILE *)0x0))) {
              local_a4 = local_a4 + 1;
            }
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'·',(uint)(_numbytes != (FILE *)0x0),"f != NULL",(void *)0x0);
            v1 = oldsize;
            v2 = fwrite(tmp,1,oldsize,_numbytes);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'¸',v1,"(size_t)size",v2,"fwrite(image, 1, (size_t)size, f)",
                                (void *)0x0);
            fclose(_numbytes);
            rawimage = (char *)archive_read_new();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'¼',(uint)((archive *)rawimage != (archive *)0x0),
                             "(a = archive_read_new()) != NULL",(void *)0x0);
            iVar1 = archive_read_support_filter_all((archive *)rawimage);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'¾',0,"ARCHIVE_OK",(long)iVar1,
                                "archive_read_support_filter_all(a)",rawimage);
            iVar1 = archive_read_support_format_all((archive *)rawimage);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'À',0,"ARCHIVE_OK",(long)iVar1,
                                "archive_read_support_format_all(a)",rawimage);
            iVar1 = archive_read_open_memory((archive *)rawimage,tmp,oldsize);
            if (iVar1 == 0) {
              while (iVar1 = archive_read_next_header((archive *)rawimage,(archive_entry **)&a),
                    iVar1 == 0) {
                do {
                  iVar1 = archive_read_data_block
                                    ((archive *)rawimage,(void **)&blk_size,(size_t *)&blk_offset,
                                     (la_int64_t *)&stack0xffffffffffffffd8);
                } while (iVar1 == 0);
              }
              archive_read_close((archive *)rawimage);
            }
            archive_read_free((archive *)rawimage);
            rawimage = (char *)archive_read_new();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'Í',(uint)((archive *)rawimage != (archive *)0x0),
                             "(a = archive_read_new()) != NULL",(void *)0x0);
            iVar1 = archive_read_support_filter_all((archive *)rawimage);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'Ï',0,"ARCHIVE_OK",(long)iVar1,
                                "archive_read_support_filter_all(a)",rawimage);
            iVar1 = archive_read_support_format_all((archive *)rawimage);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'Ñ',0,"ARCHIVE_OK",(long)iVar1,
                                "archive_read_support_format_all(a)",rawimage);
            iVar1 = archive_read_open_memory((archive *)rawimage,tmp,oldsize);
            if (iVar1 == 0) {
              do {
                iVar1 = archive_read_next_header((archive *)rawimage,(archive_entry **)&a);
              } while (iVar1 == 0);
              archive_read_close((archive *)rawimage);
            }
            archive_read_free((archive *)rawimage);
          }
          free(tmp);
          free(image);
        }
      }
      else {
        rawimage = (char *)archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'Q',(uint)((archive *)rawimage != (archive *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar1 = archive_read_support_filter_all((archive *)rawimage);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            rawimage);
        iVar1 = archive_read_support_format_raw((archive *)rawimage);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                            rawimage);
        wVar2 = archive_read_open_filenames
                          ((archive_conflict *)rawimage,
                           *(char ***)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8),0x4000);
        if (wVar2 == L'\0') {
          iVar1 = archive_read_next_header((archive *)rawimage,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                              rawimage);
          image = (char *)malloc(30000000);
          oldsize = archive_read_data((archive *)rawimage,image,30000000);
          iVar1 = archive_read_next_header((archive *)rawimage,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'e',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                              rawimage);
          iVar1 = archive_read_free((archive *)rawimage);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'h',(uint)(oldsize != 0),"size > 0",(void *)0x0);
          if ((**(long **)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) == 0) ||
             (*(long *)(*(long *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) + 8) == 0)) {
            failure("Internal buffer is not big enough for uncompressed test files");
          }
          else {
            failure("Internal buffer is not big enough for uncompressed test file: %s",
                    **(undefined8 **)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8));
          }
          wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'p',(uint)(oldsize < buff3 + 0x4ccb20),"size < buffsize",
                                   (void *)0x0);
          if (wVar2 != L'\0') goto LAB_00151fe4;
          free(image);
        }
        else {
          archive_read_free((archive *)rawimage);
          if ((**(long **)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) == 0) ||
             (*(long *)(*(long *)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8) + 8) == 0)) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'Z');
            test_skipping("Cannot uncompress fileset");
          }
          else {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\\');
            test_skipping("Cannot uncompress %s",
                          **(undefined8 **)((long)blk + (long)skip_fuzz_tests._4_4_ * 0x10 + 8));
          }
        }
      }
      skip_fuzz_tests._4_4_ = skip_fuzz_tests._4_4_ + 1;
    }
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                   ,L'@');
    test_skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ environment variable");
  }
  return;
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;
	const char *skip_fuzz_tests;

	skip_fuzz_tests = getenv("SKIP_TEST_FUZZ");
	if (skip_fuzz_tests != NULL) {
		skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ "
		    "environment variable");
		return;
	}

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				rawimage = NULL;
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				char *newraw;
				tmp = slurpfile(&size, "%s",
						filesets[n].names[i]);
				newraw = realloc(rawimage, oldsize + size);
				if (!assert(newraw != NULL))
				{
					free(tmp);
					size = 0;
					break;
				}
				rawimage = newraw;
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
			}
		}
		if (size == 0) {
			free(rawimage);
			rawimage = NULL;
			continue;
		}
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL) {
			free(rawimage);
			rawimage = NULL;
			return;
		}

		assert(rawimage != NULL);

		srand((unsigned)time(NULL));

		for (i = 0; i < 1000; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (q < 4)
				q = 4;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assert(f != NULL);
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			// Try to read all headers and bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);

			// Just list headers, skip bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}